

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reduce.cpp
# Opt level: O2

void reduce_by_index_sum<tf::StaticPartitioner<tf::DefaultClosureWrapper>>(uint W)

{
  code *pcVar1;
  double dVar2;
  pointer piVar3;
  char extraout_AL;
  int iVar4;
  ulong uVar5;
  int *i;
  pointer piVar6;
  long lVar7;
  Executor *this;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  int sol;
  int sum;
  vector<int,_std::allocator<int>_> vec;
  Task stask;
  shared_ptr<tf::WorkerInterface> local_308;
  Expression_lhs<const_int_&> local_2f0;
  ResultBuilder DOCTEST_RB;
  Result local_268;
  IndexRange<unsigned_long> range;
  Taskflow taskflow;
  Executor executor;
  
  local_308.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_308.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)W,&local_308);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_308.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  tf::Taskflow::Taskflow(&taskflow);
  std::vector<int,_std::allocator<int>_>::vector(&vec,1000,(allocator_type *)&DOCTEST_RB);
  piVar3 = vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (piVar6 = vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start; piVar6 != piVar3; piVar6 = piVar6 + 1) {
    iVar4 = rand();
    *piVar6 = iVar4 % 100 + -0x32;
  }
  uVar5 = 1;
  do {
    if ((ulong)((long)vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) <= uVar5) {
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&vec.super__Vector_base<int,_std::allocator<int>_>);
      tf::Taskflow::~Taskflow(&taskflow);
      tf::Executor::~Executor(&executor);
      return;
    }
    for (lVar7 = 0; lVar7 != 0x14; lVar7 = lVar7 + 4) {
      iVar4 = *(int *)((long)&DAT_0015aca8 + lVar7);
      std::
      vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ::clear(&taskflow._graph.
               super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             );
      sol = 10;
      DOCTEST_RB.super_AssertData.m_file = (char *)&sum;
      sum = sol;
      DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)&range;
      DOCTEST_RB.super_AssertData._8_8_ = &vec;
      tf::FlowBuilder::
      emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:423:37),_nullptr>
                ((FlowBuilder *)&stask,(anon_class_24_3_10b1740b *)&taskflow);
      tf::FlowBuilder::
      reduce_by_index<std::reference_wrapper<tf::IndexRange<unsigned_long>>,int,reduce_by_index_sum<tf::StaticPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(tf::IndexRange<unsigned_long>,std::optional<int>)_1_,std::plus<int>,tf::StaticPartitioner<tf::DefaultClosureWrapper>>
                ((FlowBuilder *)&DOCTEST_RB,&taskflow,(TestCaseData *)&range,&sol,&vec,(long)iVar4);
      tf::Node::_precede(stask._node,(Node *)DOCTEST_RB.super_AssertData.m_test_case);
      this = &executor;
      tf::Executor::run((Future<void> *)&DOCTEST_RB.super_AssertData,this,&taskflow);
      std::__basic_future<void>::wait((__basic_future<void> *)&DOCTEST_RB.super_AssertData,this);
      tf::Future<void>::~Future((Future<void> *)&DOCTEST_RB.super_AssertData);
      DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
      DOCTEST_RB.super_AssertData._71_2_ = 0x17;
      DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_2f0.m_at = DT_REQUIRE;
      DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
      DOCTEST_RB.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_reduce.cpp"
      ;
      DOCTEST_RB.super_AssertData.m_line = 0x1c3;
      DOCTEST_RB.super_AssertData.m_expr = "sol == sum";
      DOCTEST_RB.super_AssertData.m_failed = true;
      DOCTEST_RB.super_AssertData.m_threw = false;
      DOCTEST_RB.super_AssertData.m_threw_as = false;
      DOCTEST_RB.super_AssertData.m_exception_type = "";
      DOCTEST_RB.super_AssertData.m_exception_string = "";
      local_2f0.lhs = &sol;
      doctest::detail::Expression_lhs<const_int_&>::operator==<int,_nullptr>
                (&local_268,&local_2f0,&sum);
      doctest::detail::ResultBuilder::setResult
                ((ResultBuilder *)&DOCTEST_RB.super_AssertData,&local_268);
      doctest::String::~String(&local_268.m_decomp);
      dVar2 = doctest::detail::ResultBuilder::log
                        ((ResultBuilder *)&DOCTEST_RB.super_AssertData,
                         (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      if (extraout_AL != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::ResultBuilder::react((ResultBuilder *)&DOCTEST_RB.super_AssertData);
      doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void reduce_by_index_sum(unsigned W) {

  tf::Executor executor(W);
  tf::Taskflow taskflow;

  std::vector<int> vec(1000);

  for(auto& i : vec) i = ::rand() % 100 - 50;

  for(size_t n=1; n<vec.size(); n++) {
    for(size_t c : {0, 1, 3, 7, 99}) {
      
      taskflow.clear();

      int sum = 10;
      int sol = 10;
      tf::IndexRange<size_t> range;

      auto stask = taskflow.emplace([&](){
        range.reset(0, vec.size(), 1);
        REQUIRE(range.size() == vec.size());
        for(auto itr = vec.begin(); itr != vec.end(); itr++) {
          sum += *itr;
        }
      });

      tf::Task ptask;

      ptask = taskflow.reduce_by_index(
        std::ref(range),
        sol,
        [&](tf::IndexRange<size_t> subrange, std::optional<int> running_total){
          int lsum = running_total ? *running_total : 0;
          for(size_t i=subrange.begin(); i<subrange.end(); i+=subrange.step_size()) {
            lsum += vec[i];
          }
          return lsum;
        },
        std::plus<int>(), 
        P(c)
      );

      stask.precede(ptask);

      executor.run(taskflow).wait();

      REQUIRE(sol == sum);
    }
  }
}